

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  alpha_cluster *paVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint8 t;
  long lVar18;
  alpha_cluster *paVar19;
  bool bVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  vector<unsigned_char> selectors;
  results results;
  params params;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint encoding_weight [8];
  uint alpha_values [8];
  dxt5_endpoint_optimizer optimizer;
  elemental_vector local_5f8;
  ulong local_5e8;
  alpha_cluster *local_5e0;
  results local_5d8;
  params local_5c0;
  params local_5a0;
  uint *local_568;
  vector<unsigned_long_long> *local_560;
  alpha_cluster *local_558;
  long local_550;
  ulong local_548;
  dxt_hc *local_540;
  ulong local_538;
  vector<unsigned_int> *local_530;
  vector<unsigned_long_long> *local_528;
  ulong local_520;
  results local_518;
  uint local_508 [8];
  dxt_endpoint_refiner local_4e8;
  uint local_4d8 [4];
  uint local_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint local_4b4 [9];
  dxt5_endpoint_optimizer local_490;
  
  uVar3 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_4e8);
  local_5f8.m_p = (void *)0x0;
  local_5f8.m_size = 0;
  local_5f8.m_capacity = 0;
  uVar16 = (this->m_alpha_clusters).m_size;
  if ((uint)data < uVar16) {
    local_560 = this->m_block_selectors;
    local_540 = this;
    do {
      uVar10 = data & 0xffffffff;
      paVar5 = (this->m_alpha_clusters).m_p;
      local_5e8 = data;
      if (paVar5[uVar10].pixels.m_size != 0) {
        local_5e0 = paVar5 + uVar10;
        local_5c0.m_block_index = 0;
        local_5c0.m_pPixels = (local_5e0->pixels).m_p;
        uVar16 = (local_5e0->pixels).m_size;
        local_5c0.m_comp_index = 0;
        local_5c0.m_quality = cCRNDXTQualityUber;
        local_5c0.m_use_both_block_types = false;
        local_5c0.m_num_pixels = uVar16;
        if (local_5f8.m_size != uVar16) {
          if (local_5f8.m_size <= uVar16) {
            if (local_5f8.m_capacity < uVar16) {
              elemental_vector::increase_capacity
                        (&local_5f8,uVar16,local_5f8.m_size + 1 == uVar16,1,(object_mover)0x0,false)
              ;
            }
            memset((void *)((ulong)local_5f8.m_size + (long)local_5f8.m_p),0,
                   (ulong)(uVar16 - local_5f8.m_size));
          }
          local_5f8.m_size = uVar16;
        }
        local_5d8.m_pSelectors = (uint8 *)local_5f8.m_p;
        dxt5_endpoint_optimizer::compute(&local_490,&local_5c0,&local_5d8);
        paVar19 = local_5e0;
        local_5e0->first_endpoint = (uint)local_5d8.m_first_endpoint;
        local_5e0->second_endpoint = (uint)local_5d8.m_second_endpoint;
        dxt5_block::get_block_values
                  (local_508,(uint)local_5d8.m_first_endpoint,(uint)local_5d8.m_second_endpoint);
        local_568 = paVar19->alpha_values;
        lVar11 = 0;
        do {
          uVar4 = local_508[(byte)(&g_dxt5_from_linear)[lVar11]];
          paVar5[uVar10].alpha_values[lVar11] = uVar4;
          (&uStack_4b8)[lVar11] = uVar4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        iVar13 = paVar19->first_endpoint - paVar19->second_endpoint;
        uVar16 = (uint)(iVar13 * iVar13) >> 3;
        if (0x7ff < uVar16) {
          uVar16 = 0x800;
        }
        if ((uint)(iVar13 * iVar13) < 8) {
          uVar16 = 1;
        }
        fVar21 = (float)uVar16;
        uVar16 = (uint)(fVar21 * 1.15);
        uVar22 = (uint)(fVar21 * 1.1285714);
        uVar23 = (uint)(fVar21 * 1.1071428);
        uVar24 = (uint)(fVar21 * 1.0857142);
        local_4d8[0] = (int)(fVar21 * 1.15 - 2.1474836e+09) & (int)uVar16 >> 0x1f | uVar16;
        local_4d8[1] = (int)(fVar21 * 1.1285714 - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
        local_4d8[2] = (int)(fVar21 * 1.1071428 - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
        local_4d8[3] = (int)(fVar21 * 1.0857142 - 2.1474836e+09) & (int)uVar24 >> 0x1f | uVar24;
        uVar16 = (uint)(fVar21 * 1.0642858);
        uVar22 = (uint)(fVar21 * 1.0428572);
        uVar23 = (uint)(fVar21 * 1.0214286);
        uVar24 = (uint)(fVar21 * 1.0);
        local_4c8 = (int)(fVar21 * 1.0642858 - 2.1474836e+09) & (int)uVar16 >> 0x1f | uVar16;
        uStack_4c4 = (int)(fVar21 * 1.0428572 - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
        uStack_4c0 = (int)(fVar21 * 1.0214286 - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
        uStack_4bc = (int)(fVar21 * 1.0 - 2.1474836e+09) & (int)uVar24 >> 0x1f | uVar24;
        if (this->m_has_etc_color_blocks != false) {
          uVar16 = 1;
          if ((6 < iVar13) && (uVar16 = (iVar13 + 0xcU) / 0x12, 0xe < uVar16)) {
            uVar16 = 0xf;
          }
          uVar22 = (uint)local_5d8.m_first_endpoint + (uint)local_5d8.m_second_endpoint + 1 >> 1 &
                   0xff;
          lVar11 = 0;
          do {
            auVar2 = *(undefined1 (*) [16])
                      (determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar13 < 7] +
                      lVar11);
            iVar25 = auVar2._4_4_;
            auVar29._4_4_ = iVar25;
            auVar29._0_4_ = iVar25;
            auVar29._8_4_ = auVar2._12_4_;
            auVar29._12_4_ = auVar2._12_4_;
            uVar23 = auVar2._0_4_ * uVar16 + uVar22;
            uVar24 = iVar25 * uVar16 + uVar22;
            uVar26 = (int)((auVar2._8_8_ & 0xffffffff) * (ulong)uVar16) + uVar22;
            uVar27 = (int)((auVar29._8_8_ & 0xffffffff) * (ulong)uVar16) + uVar22;
            uVar28 = -(uint)((int)uVar23 < 0xff);
            uVar30 = -(uint)((int)uVar24 < 0xff);
            uVar31 = -(uint)((int)uVar26 < 0xff);
            uVar32 = -(uint)((int)uVar27 < 0xff);
            uVar23 = ~uVar28 & 0xff | uVar23 & uVar28;
            uVar24 = ~uVar30 & 0xff | uVar24 & uVar30;
            uVar26 = ~uVar31 & 0xff | uVar26 & uVar31;
            uVar27 = ~uVar32 & 0xff | uVar27 & uVar32;
            uVar23 = -(uint)(0 < (int)uVar23) & uVar23;
            uVar24 = -(uint)(0 < (int)uVar24) & uVar24;
            uVar26 = -(uint)(0 < (int)uVar26) & uVar26;
            uVar27 = -(uint)(0 < (int)uVar27) & uVar27;
            puVar1 = paVar5[uVar10].alpha_values + lVar11;
            *puVar1 = uVar23;
            puVar1[1] = uVar24;
            puVar1[2] = uVar26;
            puVar1[3] = uVar27;
            (&uStack_4b8)[lVar11] = uVar23;
            local_4b4[lVar11] = uVar24;
            local_4b4[lVar11 + 1] = uVar26;
            local_4b4[lVar11 + 2] = uVar27;
            lVar11 = lVar11 + 4;
          } while (lVar11 != 8);
          paVar19->first_endpoint = uVar22;
          paVar19->second_endpoint = uVar16 << 4 | (uint)(iVar13 < 7) * 2 + 0xb;
        }
        uVar16 = this->m_num_alpha_blocks;
        if (uVar16 != 0) {
          uVar17 = 0;
          do {
            uVar14 = uVar17 + 1;
            if (paVar19->blocks[uVar17 + 1].m_size != 0) {
              local_530 = paVar19->blocks + uVar17 + 1;
              local_538 = (ulong)(this->m_params).m_alpha_component_indices[uVar17];
              local_528 = local_560 + uVar14;
              uVar17 = 0;
              do {
                uVar16 = local_530->m_p[uVar17];
                local_520 = (ulong)local_4d8[(this->m_block_encodings).m_p[uVar16]];
                lVar11 = 0;
                uVar15 = 0;
                do {
                  uVar22 = 0xffffffff;
                  lVar18 = 0;
                  uVar23 = 0;
                  do {
                    if (this->m_has_etc_color_blocks == false) {
                      bVar12 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar18);
                      if ((local_5d8.m_reordered & 1U) == 0) {
                        bVar12 = *(byte *)((long)&g_dxt5_to_linear + lVar18);
                      }
                    }
                    else {
                      bVar12 = (byte)lVar18;
                    }
                    uVar26 = (uint)this->m_blocks[uVar16 >> (this->m_has_subblocks & 0x1fU)][lVar11]
                                   .field_0.c[local_538] - (&uStack_4b8)[bVar12];
                    uVar24 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar24 = uVar26;
                    }
                    bVar20 = uVar24 < uVar22;
                    if (bVar20) {
                      uVar22 = uVar24;
                    }
                    if (bVar20) {
                      uVar23 = (uint)bVar12;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 8);
                  uVar15 = (ulong)uVar23 | uVar15 << 3;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x10);
                local_528->m_p[uVar16] = uVar15 << 0x10 | local_520;
                uVar17 = uVar17 + 1;
                this = local_540;
              } while (uVar17 < local_530->m_size);
              uVar16 = local_540->m_num_alpha_blocks;
              paVar19 = local_5e0;
              local_548 = uVar14;
            }
            uVar17 = uVar14;
            local_558 = paVar5;
            local_550 = uVar10 * 0x90;
          } while (uVar14 < uVar16);
        }
        local_5a0.m_alpha_comp_index = 0;
        local_5a0.m_highest_quality = true;
        local_5a0.m_perceptual = (this->m_params).m_perceptual;
        local_5a0.m_pSelectors = (uint8 *)local_5f8.m_p;
        local_5a0.m_pPixels = (paVar19->pixels).m_p;
        local_5a0.m_num_pixels = (paVar19->pixels).m_size;
        local_5a0.m_dxt1_selectors = false;
        local_5a0.m_error_to_beat = local_5d8.m_error;
        local_5a0.m_block_index = (uint)local_5e8;
        if (this->m_has_etc_color_blocks == false) {
          bVar20 = dxt_endpoint_refiner::refine(&local_4e8,&local_5a0,&local_518);
          paVar19->refined_alpha = bVar20;
          if (!bVar20) goto LAB_00185367;
          paVar19->first_endpoint = (uint)local_518.m_low_color;
          paVar19->second_endpoint = (uint)local_518.m_high_color;
          dxt5_block::get_block_values
                    (local_508,(uint)local_518.m_low_color,(uint)local_518.m_high_color);
          lVar11 = 0;
          do {
            paVar5[uVar10].refined_alpha_values[lVar11] =
                 local_508[(byte)(&g_dxt5_from_linear)[lVar11]];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
        }
        else {
          paVar19->refined_alpha = false;
LAB_00185367:
          uVar8 = *(undefined8 *)local_568;
          uVar9 = *(undefined8 *)(local_568 + 2);
          uVar4 = local_568[5];
          uVar6 = local_568[6];
          uVar7 = local_568[7];
          paVar19->refined_alpha_values[4] = local_568[4];
          paVar19->refined_alpha_values[5] = uVar4;
          paVar19->refined_alpha_values[6] = uVar6;
          paVar19->refined_alpha_values[7] = uVar7;
          *(undefined8 *)paVar19->refined_alpha_values = uVar8;
          *(undefined8 *)(paVar19->refined_alpha_values + 2) = uVar9;
        }
        uVar16 = (this->m_alpha_clusters).m_size;
      }
      uVar22 = (int)local_5e8 + uVar3 + 1;
      data = (uint64)uVar22;
    } while (uVar22 < uVar16);
    if (local_5f8.m_p != (void *)0x0) {
      crnlib_free(local_5f8.m_p);
    }
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}